

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_file.c
# Opt level: O2

void file_handle_seek(t_file_handle *x,t_symbol *s,int argc,t_atom *argv)

{
  _outlet *x_00;
  int iVar1;
  __off_t _Var2;
  t_symbol *ptVar3;
  uint uVar4;
  char *fmt;
  t_float tVar6;
  uint uStack_30;
  t_atom a [1];
  ulong uVar5;
  
  uStack_30 = 0;
  if (argc == 2) {
    if (argv[1].a_type == A_SYMBOL) {
      ptVar3 = atom_getsymbol(argv + 1);
      uVar4 = (byte)*ptVar3->s_name - 0x43;
      uVar5 = (ulong)uVar4;
      if (uVar4 < 0x31) {
        if ((0x800100008001U >> (uVar5 & 0x3f) & 1) == 0) {
          if ((0x400000004U >> (uVar5 & 0x3f) & 1) == 0) {
            if ((0x1000000010000U >> (uVar5 & 0x3f) & 1) == 0) goto LAB_001789be;
          }
          else {
            uStack_30 = 2;
          }
        }
        else {
          uStack_30 = 1;
        }
      }
      else {
LAB_001789be:
        if (*ptVar3->s_name != 0) {
          fmt = "seek mode must be \'set\', \'end\' or \'current\' (resp. \'relative\')";
          goto LAB_00178a56;
        }
      }
      goto LAB_001789d6;
    }
  }
  else {
    if (argc != 1) {
      uStack_30 = (uint)(argc == 0);
      _Var2 = 0;
      goto LAB_001789eb;
    }
LAB_001789d6:
    if (argv->a_type == A_FLOAT) {
      tVar6 = atom_getfloat(argv);
      _Var2 = (__off_t)(int)tVar6;
LAB_001789eb:
      iVar1 = file_handle_checkopen(x,"seek");
      if (iVar1 != 0) {
        _Var2 = lseek(x->x_fhptr->fh_fd,_Var2,uStack_30);
        a[0].a_w._0_4_ = (undefined4)_Var2;
        a[0].a_type = A_FLOAT;
        x_00 = x->x_infoout;
        ptVar3 = gensym("seek");
        outlet_anything(x_00,ptVar3,1,a);
      }
      return;
    }
  }
  fmt = "usage: seek [<int:offset> [<symbol:mode>]]";
LAB_00178a56:
  pd_error(x,fmt);
  return;
}

Assistant:

static void file_handle_seek(t_file_handle*x, t_symbol*s, int argc, t_atom*argv) {
    off_t offset=0;
    int whence = SEEK_SET;
    t_atom a[1];
    switch(argc) {
    case 0:
            /* just output the current position */
        whence=SEEK_CUR;
        break;
    case 2: {
        if (A_SYMBOL!=argv[1].a_type)
            goto usage;
        s=atom_getsymbol(argv+1);
        switch(*s->s_name) {
        case 'S': case 's': case 0:
            whence = SEEK_SET;
            break;
        case 'E': case 'e':
            whence = SEEK_END;
            break;
        case 'C': case 'c': case 'R': case 'r':
            whence = SEEK_CUR;
            break;
        default:
            pd_error(x, "seek mode must be 'set', 'end' or 'current' (resp. 'relative')");
            return;
        }
    }
            /* falls through */
    case 1:
        if (A_FLOAT!=argv[0].a_type)
            goto usage;
        offset = (int)atom_getfloat(argv);
        break;
    }

    if(!file_handle_checkopen(x, "seek"))
        return;
    offset = lseek(x->x_fd, offset, whence);
    SETFLOAT(a, offset);
    outlet_anything(x->x_infoout, gensym("seek"), 1, a);
    return;
 usage:
    pd_error(x, "usage: seek [<int:offset> [<symbol:mode>]]");
}